

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O1

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_four(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  ulong *puVar1;
  pointer pVVar2;
  pointer pAVar3;
  pointer piVar4;
  pointer pIVar5;
  bool bVar6;
  byte bVar7;
  undefined8 uVar8;
  ulong uVar9;
  AdjacencyIterator it;
  pointer pAVar10;
  Step SVar11;
  pointer pAVar12;
  ulong uVar13;
  difference_type __d;
  ulong uVar14;
  pointer pAVar15;
  IndexPair local_28;
  
  local_28 = find_zero(this,0);
  SVar11 = SIX;
  if (local_28.col == 0xffffffffffffffff || local_28.row == 0xffffffffffffffff) {
LAB_00138d63:
    this->step_ = SVar11;
    return;
  }
  do {
    uVar9 = local_28.row;
    pVVar2 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar10 = *(pointer *)&((Adjacencies *)((long)(pVVar2 + uVar9) + 0x20))->vector_;
    pAVar3 = *(pointer *)((long)(pVVar2 + uVar9) + 0x28);
    pAVar12 = pAVar10;
    uVar14 = (long)pAVar3 - (long)pAVar10 >> 4;
    while (uVar13 = uVar14, 0 < (long)uVar13) {
      uVar14 = uVar13 >> 1;
      if (pAVar12[uVar14].vertex_ < local_28.col) {
        pAVar12 = pAVar12 + uVar14 + 1;
        uVar14 = ~uVar14 + uVar13;
      }
    }
    if ((pAVar3 == pAVar12) || (pAVar12->vertex_ != local_28.col)) {
      uVar14 = 0;
    }
    else {
      uVar14 = pAVar12->edge_;
    }
    piVar4 = (this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4[uVar14] = 2;
    bVar6 = pAVar10 != pAVar3;
    if (pAVar10 == pAVar3) {
LAB_00138c65:
      if (!bVar6) {
        pIVar5 = (this->path_).
                 super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->path_).
            super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
            ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
          (this->path_).
          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
        }
        std::
        vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                    *)&this->path_,&local_28.row,&local_28.col);
        SVar11 = FIVE;
        goto LAB_00138d63;
      }
    }
    else {
      pAVar12 = pAVar10;
      if (piVar4[pAVar10->edge_] != 1) {
        do {
          pAVar15 = pAVar12 + 1;
          bVar6 = pAVar15 != pAVar3;
          if (pAVar15 == pAVar3) break;
          uVar8 = pAVar12 + 1;
          pAVar12 = pAVar15;
        } while (piVar4[*(Value *)(uVar8 + 8)] != 1);
        goto LAB_00138c65;
      }
    }
    uVar14 = 0xffffffffffffffff;
    for (; pAVar10 != pAVar3; pAVar10 = pAVar10 + 1) {
      if (piVar4[pAVar10->edge_] == 1) {
        uVar14 = pAVar10->vertex_;
        break;
      }
    }
    uVar13 = uVar9 + 0x3f;
    if (-1 < (long)uVar9) {
      uVar13 = uVar9;
    }
    puVar1 = (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
             ((long)uVar13 >> 6) +
             (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)local_28.row & 0x3f);
    uVar14 = uVar14 - ((long)(this->rows_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->rows_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    uVar13 = uVar14 + 0x3f;
    if (-1 < (long)uVar14) {
      uVar13 = uVar14;
    }
    bVar7 = (byte)uVar14 & 0x3f;
    puVar1 = (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
             ((long)uVar13 >> 6) +
             (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
    local_28 = find_zero(this,uVar9 + 1);
    if ((local_28.row == 0xffffffffffffffff) || (local_28.col == 0xffffffffffffffff))
    goto LAB_00138d63;
  } while( true );
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_four()
{
    IndexPair idx;
    Index start_row{ 0 };
    while (true) {

        idx = find_zero(start_row);

        if (idx.row == IDXMAX || idx.col == IDXMAX) {
            // No zero found.
            step_ = Step::SIX;
            return;
        }

        // it is more likely to find another zero
        // _after_ the last location, so we pass it
        // as a hint to find_zero.
        start_row = idx.row + 1;

        // prime at given index.
        mask_[graph_.findEdge(idx.row, idx.col).second] = PRIMED;

        if (has_star_in_row(idx.row)) {
            const auto col = find_star_in_row(idx.row);
            row_cover[idx.row] = true;
            col_cover[col_of_idx(col)] = false;
        } else {
            // starting point for augmenting path.
            path_.clear();
            path_.emplace_back(idx.row, idx.col);
            step_ = Step::FIVE;
            return;
        }
    }
}